

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

bool __thiscall Parser::matchAny(Parser *this,vector<TokenType,_std::allocator<TokenType>_> *types)

{
  TokenType *pTVar1;
  TokenType *pTVar2;
  bool bVar3;
  TokenType *pTVar4;
  TokenType *type;
  
  pTVar1 = (types->super__Vector_base<TokenType,_std::allocator<TokenType>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar2 = (types->super__Vector_base<TokenType,_std::allocator<TokenType>_>)._M_impl.
           super__Vector_impl_data._M_start;
  do {
    pTVar4 = pTVar2;
    if (pTVar4 == pTVar1) break;
    bVar3 = match(this,*pTVar4);
    pTVar2 = pTVar4 + 1;
  } while (!bVar3);
  return pTVar4 != pTVar1;
}

Assistant:

bool Parser::matchAny(const std::vector<TokenType>& types) {
    for(const TokenType& type : types) {
        if(match(type))
            return true;
    }
    return false;
}